

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O3

int testResourceLoader(void *vctxt,char *URL,char *ID,xmlResourceType type,int flags,
                      xmlParserInputPtr *out)

{
  char *__s1;
  int iVar1;
  xmlParserInputPtr pxVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)nb_entities;
  if (0 < lVar3) {
    lVar4 = 0;
    do {
      __s1 = *(char **)((long)testEntitiesName + lVar4);
      iVar1 = strcmp(__s1,URL);
      if (iVar1 == 0) {
        pxVar2 = (xmlParserInputPtr)
                 xmlNewInputFromString(__s1,*(undefined8 *)((long)testEntitiesValue + lVar4),2);
        *out = pxVar2;
        return 0;
      }
      lVar4 = lVar4 + 8;
    } while (lVar3 * 8 != lVar4);
  }
  iVar1 = xmlNewInputFromUrl(URL,0,out);
  return iVar1;
}

Assistant:

static int
testResourceLoader(void *vctxt ATTRIBUTE_UNUSED, const char *URL,
                   const char *ID ATTRIBUTE_UNUSED,
                   xmlResourceType type ATTRIBUTE_UNUSED,
                   int flags ATTRIBUTE_UNUSED, xmlParserInputPtr *out) {
    int i;

    for (i = 0; i < nb_entities; i++) {
        if (!strcmp(testEntitiesName[i], URL)) {
	    *out = xmlNewInputFromString(testEntitiesName[i],
                                        testEntitiesValue[i],
                                        XML_INPUT_BUF_STATIC);
	    return(XML_ERR_OK);
	}
    }

    return(xmlNewInputFromUrl(URL, 0, out));
}